

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctemplate.c
# Opt level: O0

void ctemplate_destroy(ctemplate_t *ctemplate)

{
  loader_module_t *plVar1;
  long *in_RDI;
  
  while (*in_RDI != 0) {
    plVar1 = loader_unloadModule((loader_module_t *)ctemplate);
    *in_RDI = (long)plVar1;
  }
  safe_destroy((csafestring_t *)0x104664);
  safe_destroy((csafestring_t *)0x104671);
  modules_destroy((translation_module_t *)0x10467e);
  free(in_RDI);
  return;
}

Assistant:

void ctemplate_destroy(ctemplate_t *ctemplate) {
	while ( ctemplate->modules != NULL ) {
		ctemplate->modules = loader_unloadModule(ctemplate->modules);
	}
	safe_destroy(ctemplate->templateBaseDir);
	safe_destroy(ctemplate->workingBaseDir);
	modules_destroy(ctemplate->translation_modules);
	free(ctemplate);
}